

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

TanhActivation * __thiscall notch::core::TanhActivation::tag_abi_cxx11_(TanhActivation *this)

{
  long in_RSI;
  TanhActivation *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x10));
  return this;
}

Assistant:

virtual std::string tag() const { return name; }